

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macro.c
# Opt level: O0

int macro_sim_dst(char *out,uint32_t c,uint32_t res,macro_interpreter_state *istate)

{
  uint32_t uVar1;
  obj *obj_00;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  int iVar7;
  uint uVar8;
  uint32_t *mthd_00;
  uint32_t *incr_00;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  undefined8 in_stack_fffffffffffffd58;
  undefined4 uVar13;
  undefined8 in_stack_fffffffffffffd68;
  undefined4 uVar14;
  undefined8 in_stack_fffffffffffffd70;
  undefined4 uVar15;
  undefined8 in_stack_fffffffffffffd88;
  undefined4 uVar16;
  undefined8 in_stack_fffffffffffffd90;
  undefined4 uVar17;
  undefined8 in_stack_fffffffffffffdb0;
  undefined4 uVar18;
  undefined8 in_stack_fffffffffffffdb8;
  undefined4 uVar19;
  uint32_t mthd_data_1;
  uint32_t mthd_data;
  obj *obj;
  uint32_t *incr;
  uint32_t *mthd;
  uint32_t *regs;
  macro_interpreter_state *istate_local;
  uint32_t res_local;
  uint32_t c_local;
  char *out_local;
  
  uVar19 = (undefined4)((ulong)in_stack_fffffffffffffdb8 >> 0x20);
  uVar17 = (undefined4)((ulong)in_stack_fffffffffffffd90 >> 0x20);
  uVar14 = (undefined4)((ulong)in_stack_fffffffffffffd68 >> 0x20);
  uVar18 = (undefined4)((ulong)in_stack_fffffffffffffdb0 >> 0x20);
  uVar16 = (undefined4)((ulong)in_stack_fffffffffffffd88 >> 0x20);
  uVar13 = (undefined4)((ulong)in_stack_fffffffffffffd58 >> 0x20);
  uVar15 = (undefined4)((ulong)in_stack_fffffffffffffd70 >> 0x20);
  mthd_00 = &istate->mthd;
  incr_00 = &istate->incr;
  obj_00 = istate->obj;
  if ((c & 0x70) == 0) {
    if (istate->macro_param == (uint32_t *)0x0) {
      return 1;
    }
    pcVar9 = reg1_str(c);
    sprintf(outs,"%s := %s0x%x%s",pcVar9,colors->num,(ulong)*istate->macro_param,colors->reset);
    uVar1 = *istate->macro_param;
    iVar7 = reg1(c);
    istate->regs[iVar7] = uVar1;
    istate->macro_param = (uint32_t *)0x0;
  }
  else if ((c & 0x70) == 0x10) {
    pcVar9 = reg1_str(c);
    sprintf(out,"%s := %s0x%x%s",pcVar9,colors->num,(ulong)res,colors->reset);
    iVar7 = reg1(c);
    istate->regs[iVar7] = res;
  }
  else if ((c & 0x770) == 0x20) {
    decode_maddr(res,mthd_00,incr_00);
    decode_method_raw(*mthd_00,0,obj_00,dec_obj,dec_mthd,(char *)0x0);
    sprintf(out,"%s := %s0x%x%s [%s.%s], %s := %s%d%s",mcr_mthd,colors->num,(ulong)*mthd_00,
            colors->reset,dec_obj,dec_mthd,mcr_incr,colors->num,CONCAT44(uVar14,*incr_00),
            colors->reset);
  }
  else if ((c & 0x70) == 0x20) {
    decode_maddr(res,mthd_00,incr_00);
    decode_method_raw(*mthd_00,0,obj_00,dec_obj,dec_mthd,(char *)0x0);
    pcVar9 = reg1_str(c);
    sprintf(out,"%s := %s := %s0x%x%s [%s.%s], %s := %s%d%s",pcVar9,mcr_mthd,colors->num,
            (ulong)*mthd_00,colors->reset,dec_obj,dec_mthd,mcr_incr,colors->num,
            CONCAT44(uVar15,*incr_00),colors->reset);
    iVar7 = reg1(c);
    istate->regs[iVar7] = res;
  }
  else if ((c & 0x70) == 0x30) {
    if (istate->macro_param == (uint32_t *)0x0) {
      return 1;
    }
    decode_method_raw(*mthd_00,res,obj_00,dec_obj,dec_mthd,dec_val);
    register_method_call(istate,res);
    pcVar9 = colors->num;
    pcVar2 = colors->reset;
    pcVar10 = reg1_str(c);
    sprintf(out,"%s.%s := %s0x%x%s [%s], %s := %s0x%x%s",dec_obj,dec_mthd,pcVar9,(ulong)res,pcVar2,
            dec_val,pcVar10,colors->num,CONCAT44(uVar14,*istate->macro_param),colors->reset);
    *mthd_00 = *incr_00 * 4 + *mthd_00;
    uVar1 = *istate->macro_param;
    iVar7 = reg1(c);
    istate->regs[iVar7] = uVar1;
    istate->macro_param = (uint32_t *)0x0;
  }
  else if ((c & 0x770) == 0x40) {
    decode_method_raw(*mthd_00,res,obj_00,dec_obj,dec_mthd,dec_val);
    register_method_call(istate,res);
    sprintf(out,"%s.%s := %s0x%x%s [%s]",dec_obj,dec_mthd,colors->num,(ulong)res,colors->reset,
            dec_val);
    *mthd_00 = *incr_00 * 4 + *mthd_00;
  }
  else if ((c & 0x70) == 0x40) {
    decode_method_raw(*mthd_00,res,obj_00,dec_obj,dec_mthd,dec_val);
    register_method_call(istate,res);
    pcVar9 = colors->num;
    pcVar2 = colors->reset;
    pcVar10 = reg1_str(c);
    sprintf(out,"%s.%s := %s0x%x%s [%s], %s := %s0x%x%s",dec_obj,dec_mthd,pcVar9,(ulong)res,pcVar2,
            dec_val,pcVar10,colors->num,CONCAT44(uVar14,res),colors->reset);
    *mthd_00 = *incr_00 * 4 + *mthd_00;
    iVar7 = reg1(c);
    istate->regs[iVar7] = res;
  }
  else if ((c & 0x70) == 0x50) {
    if (istate->macro_param == (uint32_t *)0x0) {
      return 1;
    }
    decode_maddr(res,mthd_00,incr_00);
    decode_method_raw(*mthd_00,0,obj_00,dec_obj,dec_mthd,(char *)0x0);
    pcVar5 = mcr_incr;
    pcVar4 = mcr_mthd;
    pcVar9 = colors->num;
    uVar8 = *mthd_00;
    pcVar2 = colors->reset;
    pcVar10 = colors->num;
    uVar1 = *incr_00;
    pcVar3 = colors->reset;
    pcVar11 = reg1_str(c);
    sprintf(out,"%s := %s0x%x%s [%s.%s], %s := %s%d%s, %s := %s0x%x%s",pcVar4,pcVar9,(ulong)uVar8,
            pcVar2,dec_obj,dec_mthd,pcVar5,pcVar10,CONCAT44(uVar14,uVar1),pcVar3,pcVar11,colors->num
            ,CONCAT44(uVar16,*istate->macro_param),colors->reset);
    uVar1 = *istate->macro_param;
    iVar7 = reg1(c);
    istate->regs[iVar7] = uVar1;
    istate->macro_param = (uint32_t *)0x0;
  }
  else if ((c & 0x770) == 0x60) {
    if (istate->macro_param == (uint32_t *)0x0) {
      return 1;
    }
    decode_maddr(res,mthd_00,incr_00);
    decode_method_raw(*mthd_00,*istate->macro_param,obj_00,dec_obj,dec_mthd,dec_val);
    register_method_call(istate,*istate->macro_param);
    sprintf(out,"%s := %s0x%x%s [%s.%s], %s := %s%d%s, %s.%s := %s0x%x%s [%s]",mcr_mthd,colors->num,
            (ulong)*mthd_00,colors->reset,dec_obj,dec_mthd,mcr_incr,colors->num,
            CONCAT44(uVar14,*incr_00),colors->reset,dec_obj,dec_mthd,colors->num,
            CONCAT44(uVar17,*istate->macro_param),colors->reset,dec_val);
    *mthd_00 = *incr_00 * 4 + *mthd_00;
    istate->macro_param = (uint32_t *)0x0;
  }
  else if ((c & 0x70) == 0x60) {
    if (istate->macro_param == (uint32_t *)0x0) {
      return 1;
    }
    decode_maddr(res,mthd_00,incr_00);
    decode_method_raw(*mthd_00,*istate->macro_param,obj_00,dec_obj,dec_mthd,dec_val);
    register_method_call(istate,*istate->macro_param);
    pcVar9 = reg1_str(c);
    sprintf(out,"%s := %s0x%x%s, %s := %s0x%x%s [%s.%s], %s := %s%d%s, %s.%s := %s0x%x%s [%s]",
            pcVar9,colors->num,(ulong)res,colors->reset,mcr_mthd,colors->num,
            CONCAT44(uVar13,*mthd_00),colors->reset,dec_obj,dec_mthd,mcr_incr,colors->num,
            CONCAT44(uVar16,*incr_00),colors->reset,dec_obj,dec_mthd,colors->num,
            CONCAT44(uVar18,*istate->macro_param),colors->reset,dec_val);
    *mthd_00 = *incr_00 * 4 + *mthd_00;
    iVar7 = reg1(c);
    istate->regs[iVar7] = res;
    istate->macro_param = (uint32_t *)0x0;
  }
  else if ((c & 0x770) == 0x70) {
    decode_maddr(res,mthd_00,(uint32_t *)0x0);
    uVar8 = res >> 0xc & 0x3f;
    decode_method_raw(*mthd_00,uVar8,obj_00,dec_obj,dec_mthd,dec_val);
    register_method_call(istate,uVar8);
    sprintf(out,"%s := %s0x%x%s [%s.%s], %s := %s%d%s, %s.%s := %s0x%x%s [%s]",mcr_mthd,colors->num,
            (ulong)*mthd_00,colors->reset,dec_obj,dec_mthd,mcr_incr,colors->num,
            CONCAT44(uVar14,*incr_00),colors->reset,dec_obj,dec_mthd,colors->num,
            CONCAT44(uVar17,res >> 0xc) & 0xffffffff0000003f,colors->reset,dec_val);
    *mthd_00 = *incr_00 * 4 + *mthd_00;
  }
  else if ((c & 0x70) == 0x70) {
    decode_maddr(res,mthd_00,(uint32_t *)0x0);
    uVar8 = res >> 0xc & 0x3f;
    decode_method_raw(*mthd_00,uVar8,obj_00,dec_obj,dec_mthd,dec_val);
    register_method_call(istate,uVar8);
    pcVar6 = mcr_incr;
    pcVar11 = mcr_mthd;
    pcVar9 = colors->num;
    uVar8 = *mthd_00;
    pcVar2 = colors->reset;
    pcVar10 = colors->num;
    uVar1 = *incr_00;
    pcVar3 = colors->reset;
    pcVar4 = colors->num;
    pcVar5 = colors->reset;
    pcVar12 = reg1_str(c);
    sprintf(out,"%s := %s0x%x%s [%s.%s], %s := %s%d%s, %s.%s := %s0x%x%s [%s], %s := %s0x%x%s",
            pcVar11,pcVar9,(ulong)uVar8,pcVar2,dec_obj,dec_mthd,pcVar6,pcVar10,
            CONCAT44(uVar14,uVar1),pcVar3,dec_obj,dec_mthd,pcVar4,
            CONCAT44(uVar17,res >> 0xc) & 0xffffffff0000003f,pcVar5,dec_val,pcVar12,colors->num,
            CONCAT44(uVar19,res),colors->reset);
    iVar7 = reg1(c);
    istate->regs[iVar7] = res;
    *mthd_00 = *incr_00 * 4 + *mthd_00;
  }
  else {
    sprintf(out,"???");
  }
  return 0;
}

Assistant:

static int macro_sim_dst(char *out, uint32_t c, uint32_t res,
		struct macro_interpreter_state *istate)
{
	uint32_t *regs = istate->regs;
	uint32_t *mthd = &istate->mthd;
	uint32_t *incr = &istate->incr;
	struct obj *obj = istate->obj;

	if ((c & 0x00000070) == 0x00000000)
	{
		// { 0x00000000, 0x00000070, N("parm"), REG1, N("ign") }
		// ignore result, fetch param to REG1
		if (!istate->macro_param)
			return 1;
		sprintf(outs,
				"%s := %s0x%x%s", // $rX := 0x...
				reg1_str(c), colors->num, *istate->macro_param, colors->reset);

		regs[reg1(c)] = *istate->macro_param;
		istate->macro_param = NULL;
	}
	else if ((c & 0x00000070) == 0x00000010)
	{
		// { 0x00000010, 0x00000070, N("mov"), REG1 }
		// store result to REG1
		sprintf(out,
				"%s := %s0x%x%s", // $rX := 0x...
				reg1_str(c), colors->num, res, colors->reset);

		regs[reg1(c)] = res;
	}
	else if ((c & 0x00000770) == 0x00000020)
	{
		// { 0x00000020, 0x00000770, N("maddr") }
		decode_maddr(res, mthd, incr);

		decode_method_raw(*mthd, 0, obj, dec_obj, dec_mthd, NULL);
		sprintf(out,
				"%s := %s0x%x%s [%s.%s], " // mthd := 0x.... [NVXX_3D....]
				"%s := %s%d%s",            // incr := ...
				mcr_mthd, colors->num, *mthd, colors->reset, dec_obj, dec_mthd,
				mcr_incr, colors->num, *incr, colors->reset);
	}
	else if ((c & 0x00000070) == 0x00000020)
	{
		// { 0x00000020, 0x00000070, N("maddr"), REG1 }
		// use result as maddr and store it to REG1
		decode_maddr(res, mthd, incr);

		decode_method_raw(*mthd, 0, obj, dec_obj, dec_mthd, NULL);
		sprintf(out,
				"%s := %s := %s0x%x%s [%s.%s], " // $rX := mthd := 0x... [NVXX_3D....]
				"%s := %s%d%s",                  // incr := ...
				reg1_str(c), mcr_mthd, colors->num, *mthd, colors->reset, dec_obj, dec_mthd,
				mcr_incr, colors->num, *incr, colors->reset);

		regs[reg1(c)] = res;
	}
	else if ((c & 0x00000070) == 0x00000030)
	{
		// { 0x00000030, 0x00000070, N("parm"), REG1, N("send") }
		// send result, then fetch param to REG1
		if (!istate->macro_param)
			return 1;

		decode_method_raw(*mthd, res, obj, dec_obj, dec_mthd, dec_val);
		register_method_call(istate, res);

		sprintf(out,
				"%s.%s := %s0x%x%s [%s], " // NVXX_3D.... := 0x... [desc_val]
				"%s := %s0x%x%s",          // $rX := 0x...
				dec_obj, dec_mthd, colors->num, res, colors->reset, dec_val,
				reg1_str(c), colors->num, *istate->macro_param, colors->reset);

		*mthd += *incr * 4;
		regs[reg1(c)] = *istate->macro_param;
		istate->macro_param = NULL;
	}
	else if ((c & 0x00000770) == 0x00000040)
	{
		// { 0x00000040, 0x00000770, N("send") }
		decode_method_raw(*mthd, res, obj, dec_obj, dec_mthd, dec_val);
		register_method_call(istate, res);

		sprintf(out,
				"%s.%s := %s0x%x%s [%s]", // NVXX_3D.... := 0x... [desc_val]
				dec_obj, dec_mthd, colors->num, res, colors->reset, dec_val);

		*mthd += *incr * 4;
	}
	else if ((c & 0x00000070) == 0x00000040)
	{
		// { 0x00000040, 0x00000070, N("send"), REG1 }
		// send result and store it to REG1
		decode_method_raw(*mthd, res, obj, dec_obj, dec_mthd, dec_val);
		register_method_call(istate, res);

		sprintf(out,
				"%s.%s := %s0x%x%s [%s], " // NVXX_3D.... := 0x... [desc_val]
				"%s := %s0x%x%s",          // $rX := 0x...
				dec_obj, dec_mthd, colors->num, res, colors->reset, dec_val,
				reg1_str(c), colors->num, res, colors->reset);

		*mthd += *incr * 4;
		regs[reg1(c)] = res;
	}
	else if ((c & 0x00000070) == 0x00000050)
	{
		// { 0x00000050, 0x00000070, N("parm"), REG1, N("maddr") }
		// use result as maddr, then fetch param to REG1
		if (!istate->macro_param)
			return 1;

		decode_maddr(res, mthd, incr);

		decode_method_raw(*mthd, 0, obj, dec_obj, dec_mthd, NULL);

		sprintf(out,
				"%s := %s0x%x%s [%s.%s], " // mthd := 0x... [NVXX_3D....]
				"%s := %s%d%s, "           // incr := ...
				"%s := %s0x%x%s",          // $rX := 0x...
				mcr_mthd, colors->num, *mthd, colors->reset, dec_obj, dec_mthd,
				mcr_incr, colors->num, *incr, colors->reset,
				reg1_str(c), colors->num, *istate->macro_param, colors->reset);

		regs[reg1(c)] = *istate->macro_param;
		istate->macro_param = NULL;
	}
	else if ((c & 0x00000770) == 0x00000060)
	{
		// { 0x00000060, 0x00000770, N("parmsend"), N("maddr") }
		// use result as maddr, then fetch param and send it.
		if (!istate->macro_param)
			return 1;

		decode_maddr(res, mthd, incr);

		decode_method_raw(*mthd, *istate->macro_param, obj, dec_obj, dec_mthd, dec_val);
		register_method_call(istate, *istate->macro_param);

		sprintf(out,
				"%s := %s0x%x%s [%s.%s], " // mthd := 0x... [NVXX_3D....]
				"%s := %s%d%s, "           // incr := ...
				"%s.%s := %s0x%x%s [%s]",  // NVXX_3D.... := 0x... [desc_val]
				mcr_mthd, colors->num, *mthd, colors->reset, dec_obj, dec_mthd,
				mcr_incr, colors->num, *incr, colors->reset,
				dec_obj, dec_mthd, colors->num, *istate->macro_param, colors->reset, dec_val);

		*mthd += *incr * 4;
		istate->macro_param = NULL;
	}
	else if ((c & 0x00000070) == 0x00000060)
	{
		// { 0x00000060, 0x00000070, N("parmsend"), N("maddr"), REG1 }
		// use result as maddr and store it to REG1, then fetch param and send it.
		if (!istate->macro_param)
			return 1;

		decode_maddr(res, mthd, incr);

		decode_method_raw(*mthd, *istate->macro_param, obj, dec_obj, dec_mthd, dec_val);
		register_method_call(istate, *istate->macro_param);

		sprintf(out,
				"%s := %s0x%x%s, "         // rX := 0x...
				"%s := %s0x%x%s [%s.%s], " // mthd := 0x... [NVXX_3D....]
				"%s := %s%d%s, "           // incr := 0x...
				"%s.%s := %s0x%x%s [%s]",  // NVXX_3D.... := 0x... [desc_val]
				reg1_str(c), colors->num, res, colors->reset,
				mcr_mthd, colors->num, *mthd, colors->reset, dec_obj, dec_mthd,
				mcr_incr, colors->num, *incr, colors->reset,
				dec_obj, dec_mthd, colors->num, *istate->macro_param, colors->reset, dec_val);

		*mthd += *incr * 4;
		regs[reg1(c)] = res;
		istate->macro_param = NULL;
	}
	else if ((c & 0x00000770) == 0x00000070)
	{
		// { 0x00000070, 0x00000770, N("maddrsend") }
		// use result as maddr, then send bits 12-17 of result
		decode_maddr(res, mthd, NULL);

		uint32_t mthd_data = (res >> 12) & 0x3f;

		decode_method_raw(*mthd, mthd_data, obj, dec_obj, dec_mthd, dec_val);
		register_method_call(istate, mthd_data);

		sprintf(out,
				"%s := %s0x%x%s [%s.%s], " // mthd := 0x... [NVXX_3D....]
				"%s := %s%d%s, "           // incr := ...
				"%s.%s := %s0x%x%s [%s]",  // NVXX_3D.... := 0x... [desc_val]
				mcr_mthd, colors->num, *mthd, colors->reset, dec_obj, dec_mthd,
				mcr_incr, colors->num, *incr, colors->reset,
				dec_obj, dec_mthd, colors->num, mthd_data, colors->reset, dec_val);

		*mthd += *incr * 4;
	}
	else if ((c & 0x00000070) == 0x00000070)
	{
		// { 0x00000070, 0x00000070, N("maddrsend"), REG1 }
		// use result as maddr, then send bits 12-17 of result, then store result to REG1
		decode_maddr(res, mthd, NULL);

		uint32_t mthd_data = (res >> 12) & 0x3f;

		decode_method_raw(*mthd, mthd_data, obj, dec_obj, dec_mthd, dec_val);
		register_method_call(istate, mthd_data);

		sprintf(out,
				"%s := %s0x%x%s [%s.%s], " // mthd := 0x... [NVXX_3D....]
				"%s := %s%d%s, "           // incr := ...
				"%s.%s := %s0x%x%s [%s], " // NVXX_3D.... := 0x... [desc_val]
				"%s := %s0x%x%s",          // $rX := 0x...
				mcr_mthd, colors->num, *mthd, colors->reset, dec_obj, dec_mthd,
				mcr_incr, colors->num, *incr, colors->reset,
				dec_obj, dec_mthd, colors->num, mthd_data, colors->reset, dec_val,
				reg1_str(c), colors->num, res, colors->reset);

		regs[reg1(c)] = res;
		*mthd += *incr * 4;
	}
	else
		sprintf(out, "???");

	return 0;
}